

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  int iVar1;
  int iVar2;
  dasm_State *pdVar3;
  int *piVar4;
  byte bVar5;
  uint uVar6;
  dasm_Section *pdVar7;
  int *piVar8;
  sbyte sVar9;
  byte *pbVar10;
  int *piVar11;
  byte *pbVar12;
  uint local_d4;
  ptrdiff_t local_c8;
  uint local_ac;
  int fill;
  int idx;
  int *pb_1;
  int *pb;
  byte *pbStack_88;
  int shrink;
  uchar *ex;
  int t;
  int mrm;
  uchar *mm;
  int n;
  int action;
  uchar *mark;
  dasm_ActList p;
  int *endb;
  int *b;
  dasm_Section *sec;
  byte *pbStack_38;
  int secnum;
  uchar *cp;
  uchar *base;
  dasm_State *D;
  void *buffer_local;
  BuildCtx *ctx_local;
  
  pdVar3 = ctx->D;
  sec._4_4_ = 0;
  pbStack_38 = (byte *)buffer;
  do {
    if (pdVar3->maxsection <= sec._4_4_) {
      if ((byte *)((long)buffer + pdVar3->codesize) == pbStack_38) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x2000000;
      }
      return ctx_local._4_4_;
    }
    pdVar7 = pdVar3->sections + sec._4_4_;
    endb = pdVar7->buf;
    piVar4 = pdVar7->rbuf;
    iVar1 = pdVar7->pos;
LAB_001066c2:
    if (endb != piVar4 + iVar1) {
      _n = (byte *)0x0;
      mark = pdVar3->actionlist + *endb;
      endb = endb + 1;
LAB_001066f9:
      while( true ) {
        pbVar10 = mark + 1;
        mm._4_1_ = *mark;
        uVar6 = (uint)mm._4_1_;
        if ((uVar6 < 0xe9) || (0xfa < uVar6)) {
          local_ac = 0;
        }
        else {
          local_ac = *endb;
          endb = endb + 1;
        }
        mm._0_4_ = local_ac;
        if (uVar6 - 0xe9 < 0x17) break;
LAB_00106e31:
        mark = pbVar10;
        *pbStack_38 = mm._4_1_;
        pbStack_38 = pbStack_38 + 1;
      }
      switch(uVar6) {
      case 0xe9:
        if (_n == (byte *)0x0) {
          _n = pbStack_38;
        }
        pbVar12 = _n;
        if ((*pbVar10 != 0xef) && (*pbVar10 != 0xee)) {
          _n = (byte *)0x0;
        }
        if (local_ac == 0) {
          bVar5 = pbVar12[-1] & 7;
          if (bVar5 == 4) {
            bVar5 = *pbVar12 & 7;
          }
          if (bVar5 != 5) {
            pbVar12[-1] = pbVar12[-1] + 0x80;
            mark = pbVar10;
            goto LAB_001066f9;
          }
        }
        mark = pbVar10;
        if ((local_ac + 0x80 & 0xffffff00) == 0) {
          pbVar12[-1] = pbVar12[-1] - 0x40;
          goto switchD_0010677b_caseD_ea;
        }
        break;
      default:
switchD_0010677b_caseD_ea:
        mark = pbVar10;
        goto LAB_00106823;
      case 0xec:
switchD_0010677b_caseD_ec:
        pbVar12 = pbStack_38 + 1;
        *pbStack_38 = (byte)local_ac;
        pbStack_38 = pbStack_38 + 2;
        *pbVar12 = (byte)(local_ac >> 8);
        mark = pbVar10;
        goto LAB_001066f9;
      case 0xed:
        goto switchD_0010677b_caseD_ed;
      case 0xee:
        if ((local_ac + 0x80 & 0xffffff00) != 0) {
          _n = (byte *)0x0;
          goto switchD_0010677b_caseD_ec;
        }
LAB_00106852:
        if (_n == (byte *)0x0) {
          _n = pbStack_38;
        }
        _n[-2] = _n[-2] + 2;
        _n = (byte *)0x0;
        mark = pbVar10;
LAB_00106823:
        *pbStack_38 = (byte)(uint)mm;
        pbStack_38 = pbStack_38 + 1;
        goto LAB_001066f9;
      case 0xef:
        if ((local_ac + 0x80 & 0xffffff00) == 0) goto LAB_00106852;
        _n = (byte *)0x0;
        goto switchD_0010677b_caseD_ed;
      case 0xf0:
        uVar6 = (uint)*pbVar10;
        pbStack_88 = pbStack_38 + -(long)(int)(uVar6 & 7);
        if (((local_ac & 8) == 0) || (0x9f < uVar6)) {
          if ((local_ac & 0x10) != 0) {
            if ((*pbStack_88 & 0x80) != 0) {
              *pbStack_88 = 0xc5;
              pbStack_88[1] = pbStack_88[1] & 0x80 | pbStack_88[2];
              pbStack_88 = pbStack_88 + 2;
            }
            while (pbVar10 = pbStack_88 + 1, pbVar10 < pbStack_38) {
              *pbStack_88 = *pbVar10;
              pbStack_88 = pbVar10;
            }
            if (_n != (byte *)0x0) {
              _n = _n + -1;
            }
            pbStack_38 = pbStack_38 + -1;
            mm._0_4_ = local_ac & 7;
          }
        }
        else {
          sVar9 = (sbyte)((int)uVar6 >> 6);
          if ((*pbStack_88 & 0x80) == 0) {
            *pbStack_88 = *pbStack_88 ^ (byte)(1 << sVar9);
          }
          else {
            pbStack_88[1] = pbStack_88[1] ^ (byte)(0x20 << sVar9);
          }
          mm._0_4_ = local_ac & 7;
        }
        if (uVar6 < 0xc0) {
          if (uVar6 < 0x40) {
            if (((uint)mm == 4) && (uVar6 < 0x20)) {
              pbStack_38[-1] = pbStack_38[-1] ^ 4;
              *pbStack_38 = 0x20;
              pbStack_38 = pbStack_38 + 1;
            }
          }
          else {
            mm._0_4_ = (uint)mm << 3;
          }
        }
        else {
          mm._0_1_ = (byte)((uint)mm << 4);
        }
        pbStack_38[-1] = pbStack_38[-1] ^ (byte)mm;
        mark = mark + 2;
        goto LAB_001066f9;
      case 0xf1:
        mark = mark + 2;
        bVar5 = *pbVar10;
        while ((uint)mm != 0) {
          *pbStack_38 = bVar5;
          mm._0_4_ = (uint)mm - 1;
          pbStack_38 = pbStack_38 + 1;
        }
        goto LAB_001066f9;
      case 0xf2:
      case 0xf9:
        mark = pbVar10;
        goto LAB_001066f9;
      case 0xf3:
        goto switchD_0010677b_caseD_f3;
      case 0xf4:
        mark = mark + 2;
        if (-1 < (int)local_ac) goto LAB_00106b43;
        endb = endb + 1;
        mm._0_4_ = (uint)pdVar3->globals[(int)(-10 - local_ac)];
        pbVar10 = mark;
        goto switchD_0010677b_caseD_f3;
      case 0xf5:
        mark = pbVar10;
LAB_00106b43:
        piVar11 = endb + 1;
        iVar2 = *endb;
        piVar8 = pdVar3->sections[(int)local_ac >> 0x18].rbuf + (int)local_ac;
        endb = piVar11;
        if (-1 < *piVar8) {
          mm._0_4_ = *piVar8 - ((((int)pbStack_38 - (int)buffer) + 4) - iVar2);
          if (iVar2 != 0) {
            if (iVar2 == 4) {
              pbStack_38[-2] = pbStack_38[-1] - 0x10;
              pbStack_38 = pbStack_38 + -1;
            }
            else {
              pbStack_38[-1] = 0xeb;
            }
            goto LAB_00106823;
          }
          break;
        }
        mm._0_4_ = piVar8[1];
        goto LAB_00106b2a;
      case 0xf6:
        pbVar10 = mark + 2;
        if (-1 < (int)local_ac) goto switchD_0010677b_caseD_f7;
        pbStack_38 = dasma_(pbStack_38,(ptrdiff_t)pdVar3->globals[(int)(-10 - local_ac)]);
        mark = mark + 2;
        goto LAB_001066f9;
      case 0xf7:
switchD_0010677b_caseD_f7:
        mark = pbVar10;
        piVar8 = pdVar3->sections[(int)local_ac >> 0x18].rbuf + (int)local_ac;
        if (*piVar8 < 0) {
          local_c8 = (ptrdiff_t)piVar8[1];
        }
        else {
          local_c8 = (long)*piVar8 + (long)buffer;
        }
        pbStack_38 = dasma_(pbStack_38,local_c8);
        goto LAB_001066f9;
      case 0xf8:
        mark = mark + 2;
        if (9 < *pbVar10) {
          if (*mark == 0xf2) {
            local_d4 = *endb;
          }
          else {
            local_d4 = local_ac;
          }
          pdVar3->globals[(int)(*pbVar10 - 10)] = (void *)((long)buffer + (long)(int)local_d4);
        }
        goto LAB_001066f9;
      case 0xfa:
        mark = mark + 2;
        bVar5 = *pbVar10;
        while (((long)pbStack_38 - (long)buffer & (long)(int)(uint)bVar5) != 0) {
          *pbStack_38 = 0x90;
          pbStack_38 = pbStack_38 + 1;
        }
        goto LAB_001066f9;
      case 0xfb:
        mm._0_4_ = collect_reloc(ctx,pbStack_38,(uint)mark[2],(uint)*pbVar10);
        mark = mark + 3;
        break;
      case 0xfc:
        mm._4_1_ = *pbVar10;
        pbVar10 = mark + 2;
        goto LAB_00106e31;
      case 0xfd:
        goto switchD_0010677b_caseD_fd;
      case 0xfe:
      case 0xff:
        goto LAB_00106e50;
      }
      goto LAB_00106885;
    }
    sec._4_4_ = sec._4_4_ + 1;
  } while( true );
LAB_00106e50:
  goto LAB_001066c2;
switchD_0010677b_caseD_fd:
  _n = pbStack_38;
  mark = pbVar10;
  goto LAB_001066f9;
switchD_0010677b_caseD_f3:
  mark = pbVar10;
LAB_00106b2a:
  mm._0_4_ = (uint)mm - ((int)pbStack_38 + 4);
LAB_00106885:
  *pbStack_38 = (byte)(uint)mm;
  pbStack_38[1] = (byte)((uint)mm >> 8);
  pbStack_38[2] = (byte)((uint)mm >> 0x10);
  pbStack_38[3] = (byte)((uint)mm >> 0x18);
  pbStack_38 = pbStack_38 + 4;
  goto LAB_001066f9;
switchD_0010677b_caseD_ed:
  mark = pbVar10;
  goto LAB_00106885;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n-10];
	  /* fallthrough */
	case DASM_REL_A: rel_a:
	  n -= (unsigned int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++;
	  if (n < 0) { dasma((ptrdiff_t)D->globals[-n-10]); break; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  dasma(*pb < 0 ? (ptrdiff_t)pb[1] : (*pb + (ptrdiff_t)base));
	  break;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx-10] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}